

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_assertion_tests.cpp
# Opt level: O0

void __thiscall
iu_ExpressionNot_x_iutest_x_Arithmetic_Test::iu_ExpressionNot_x_iutest_x_Arithmetic_Test
          (iu_ExpressionNot_x_iutest_x_Arithmetic_Test *this)

{
  iu_ExpressionNot_x_iutest_x_Arithmetic_Test *this_local;
  
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__iu_ExpressionNot_x_iutest_x_Arithmetic_Test_00196770;
  return;
}

Assistant:

IUTEST(ExpressionNot, Arithmetic)
{
    IUTEST_EXPECT_NOT(f() + 2 == 1);
    IUTEST_EXPECT_NOT(f() - 2 == 1);
    IUTEST_EXPECT_NOT(f() * 2 == 1);
    IUTEST_EXPECT_NOT(f() / 2 == 1);
    IUTEST_EXPECT_NOT(f() % 4 == 1);
    IUTEST_EXPECT_NOT(f() + f() + f() == 1);
}